

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Pattern::visit<register_has_no_reset::MainVisitor>
          (Pattern *this,AlwaysFFVisitor *visitor)

{
  uint *in_RDI;
  
  (*(code *)(&DAT_00c6ba68 + *(int *)(&DAT_00c6ba68 + (ulong)*in_RDI * 4)))();
  return;
}

Assistant:

decltype(auto) Pattern::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case PatternKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        CASE(Invalid, InvalidPattern);
        CASE(Wildcard, WildcardPattern);
        CASE(Constant, ConstantPattern);
        CASE(Variable, VariablePattern);
        CASE(Tagged, TaggedPattern);
        CASE(Structure, StructurePattern);
    }
#undef CASE
    // clang-format on
    SLANG_UNREACHABLE;
}